

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O2

void borg_oops(char *what)

{
  char *what_00;
  
  borg_active = false;
  what_00 = format("# Aborting (%s).",what);
  borg_note(what_00);
  borg_key_tail = borg_key_head;
  borg_queued_direction = 0;
  return;
}

Assistant:

void borg_oops(const char* what)
{
    /* Stop processing */
    borg_active = false;

    /* Give a warning */
    borg_note(format("# Aborting (%s).", what));

    /* Forget borg keys */
    borg_flush();
}